

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O2

void options_init_defaults(player_options *opts)

{
  _Bool *p_Var1;
  int opt;
  long lVar2;
  
  p_Var1 = &options[0].normal;
  for (lVar2 = 0; lVar2 != 0x2c; lVar2 = lVar2 + 1) {
    opts->opt[lVar2] = *p_Var1;
    p_Var1 = p_Var1 + 0x18;
  }
  options_restore_custom(opts,1);
  options_restore_custom(opts,0);
  opts->delay_factor = '(';
  opts->hitpoint_warn = '\x03';
  return;
}

Assistant:

void options_init_defaults(struct player_options *opts)
{
	/* Set defaults */
	int opt;
	for (opt = 0; opt < OPT_MAX; opt++)
		(*opts).opt[opt] = options[opt].normal;

	/* Override with the player's customizations. */
	options_restore_custom(opts, OP_BIRTH);
	options_restore_custom(opts, OP_INTERFACE);

	/* 40ms for the delay factor */
	(*opts).delay_factor = 40;

	/* 30% of HP */
	(*opts).hitpoint_warn = 3;
}